

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

ssize_t __thiscall
QSocks5SocketEngine::write(QSocks5SocketEngine *this,int __fd,void *__buf,size_t __n)

{
  char **this_00;
  undefined2 uVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  P _a;
  long in_FS_OFFSET;
  QByteArray local_78;
  QByteArray local_60;
  undefined4 local_48;
  undefined2 local_44;
  undefined2 local_42;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  if (*(int *)(lVar2 + 0xdc) == 3) {
    uVar1 = *(undefined2 *)(lVar2 + 0xc0);
    QHostAddress::QHostAddress((QHostAddress *)&local_60);
    this_00 = &local_60.d.ptr;
    QHostAddress::QHostAddress((QHostAddress *)this_00,(QHostAddress *)(lVar2 + 0xb8));
    local_60.d.size = -0x100000000;
    local_48 = 0xffffffff;
    local_44 = 0;
    local_40 = 0;
    local_42 = uVar1;
    lVar3 = (**(code **)(*(long *)this + 0x100))
                      (this,(char *)CONCAT44(in_register_00000034,__fd),__buf,&local_60);
    QHostAddress::~QHostAddress((QHostAddress *)this_00);
    QHostAddress::~QHostAddress((QHostAddress *)&local_60);
  }
  else {
    lVar3 = -1;
    if (*(int *)(lVar2 + 0xdc) == 1) {
      pvVar4 = (void *)0x20000;
      if ((long)__buf < 0x20000) {
        pvVar4 = __buf;
      }
      lVar3 = (**(code **)(*(long *)**(undefined8 **)(lVar2 + 0xf8) + 0xa8))();
      lVar5 = (long)pvVar4 - lVar3;
      if (lVar5 == 0 || (long)pvVar4 < lVar3) {
        lVar3 = 0;
      }
      else {
        local_60.d.d = (Data *)0x0;
        local_78.d.size = 0;
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = (char *)0x0;
        local_60.d.ptr = (char *)CONCAT44(in_register_00000034,__fd);
        local_60.d.size = lVar5;
        QByteArray::operator=(&local_78,&local_60);
        pcVar6 = local_78.d.ptr;
        if (local_78.d.ptr == (char *)0x0) {
          pcVar6 = (char *)&QByteArray::_empty;
        }
        lVar3 = QIODevice::write((char *)**(undefined8 **)(lVar2 + 0xf8),(longlong)pcVar6);
        if (0 < lVar3) {
          (**(code **)(*(long *)**(undefined8 **)(lVar2 + 0xf8) + 0xc0))
                    ((long *)**(undefined8 **)(lVar2 + 0xf8),0);
          lVar3 = lVar5;
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar3;
}

Assistant:

qint64 QSocks5SocketEngine::write(const char *data, qint64 len)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_Q_DEBUG << "write" << dump(QByteArray(data, len));

    if (d->mode == QSocks5SocketEnginePrivate::ConnectMode) {
        // clamp down the amount of bytes to transfer at once
        len = qMin<qint64>(len, MaxWriteBufferSize) - d->data->controlSocket->bytesToWrite();
        if (len <= 0)
            return 0;

        QByteArray buf = QByteArray::fromRawData(data, len);
        QByteArray sealedBuf;
        if (!d->data->authenticator->seal(buf, &sealedBuf)) {
            // ### Handle this error.
        }
        // We pass pointer and size because 'sealedBuf' is (most definitely) raw data:
        // QIODevice might have to cache the byte array if the socket cannot write the data.
        // If the _whole_ array needs to be cached then it would simply store a copy of the
        // array whose data will go out of scope and be deallocated before it can be used.
        qint64 written = d->data->controlSocket->write(sealedBuf.constData(), sealedBuf.size());

        if (written <= 0) {
            QSOCKS5_Q_DEBUG << "native write returned" << written;
            return written;
        }
        d->data->controlSocket->waitForBytesWritten(0);
        //NB: returning len rather than written for the OK case, because the "sealing" may increase the length
        return len;
#ifndef QT_NO_UDPSOCKET
    } else if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        // send to connected address
        return writeDatagram(data, len, QIpPacketHeader(d->peerAddress, d->peerPort));
#endif
    }
    //### set an error ???
    return -1;
}